

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Naming.hpp
# Opt level: O0

string * ArrVarName(int am1,int am2,string *ketstr,string *prefix)

{
  long lVar1;
  string *in_RDI;
  char (*unaff_retaddr) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  char *in_stack_00000010;
  char (*in_stack_00000018) [6];
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000030;
  string local_40 [56];
  string *args_1;
  
  args_1 = in_RDI;
  StringBuilder<char[6],char_const&,char_const(&)[2],char_const&,char_const(&)[2],std::__cxx11::string_const&>
            (in_stack_00000018,in_stack_00000010,(char (*) [2])in_stack_00000008,*unaff_retaddr,
             (char (*) [2])in_RDI,in_stack_00000030);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::__cxx11::string::string(in_RDI,local_40);
  }
  else {
    StringBuilder<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (in_stack_00000008,unaff_retaddr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
  }
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

inline std::string ArrVarName(int am1, int am2, const std::string & ketstr, const std::string & prefix = "")
{
    std::string str = StringBuilder("INT__" , amchar[am1], "_", amchar[am2], "_", ketstr);
    
    if(prefix.size())
        return StringBuilder(prefix, "_", str);
    else
        return str;
}